

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O2

void gimage::validRange<float>(Image<float,_gimage::PixelTraits<float>_> *image,float from,float to)

{
  uint uVar1;
  float fVar2;
  float ***pppfVar3;
  long lVar4;
  long i;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int j;
  ulong uVar10;
  
  uVar1 = image->depth;
  lVar4 = image->height;
  if (image->height < 1) {
    lVar4 = 0;
  }
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    lVar8 = image->width;
    if (image->width < 1) {
      lVar8 = 0;
    }
    for (lVar9 = 0; lVar9 != lVar4; lVar9 = lVar9 + 1) {
      pppfVar3 = image->img;
      for (lVar5 = 0; lVar5 != lVar8; lVar5 = lVar5 + 1) {
        fVar2 = pppfVar3[uVar7][lVar9][lVar5];
        if ((uint)ABS(fVar2) < 0x7f800000 && (to < fVar2 || fVar2 < from)) {
          for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
            pppfVar3[uVar10][lVar9][lVar5] = INFINITY;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void validRange(Image<T> &image, T from, T to)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=image.get(i, k, d);

        if ((v < from || v > to) && image.isValidS(v))
        {
          for (int j=0; j<image.getDepth(); j++)
          {
            image.setInvalid(i, k, j);
          }
        }
      }
    }
  }
}